

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingQueue.hpp
# Opt level: O3

ActionMessage * __thiscall
gmlc::containers::BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::pop
          (ActionMessage *__return_storage_ptr__,
          BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this)

{
  pointer pAVar1;
  ActionMessage *this_00;
  unique_lock<std::mutex> pullLock;
  optional<helics::ActionMessage> val;
  unique_lock<std::mutex> local_1c0;
  _Optional_payload_base<helics::ActionMessage> local_1b0;
  _Optional_payload_base<helics::ActionMessage> local_f0;
  
  try_pop((optional<helics::ActionMessage> *)&local_1b0,this);
  if (local_1b0._M_engaged == false) {
    do {
      local_1c0._M_owns = false;
      local_1c0._M_device = &this->m_pullLock;
      std::unique_lock<std::mutex>::lock(&local_1c0);
      local_1c0._M_owns = true;
      pAVar1 = (this->pullElements).
               super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if ((this->pullElements).
          super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
          super__Vector_impl_data._M_start != pAVar1) {
LAB_002679bf:
        helics::ActionMessage::ActionMessage(__return_storage_ptr__,pAVar1 + -1);
        this_00 = (this->pullElements).
                  super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
                  _M_impl.super__Vector_impl_data._M_finish + -1;
        (this->pullElements).
        super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
        super__Vector_impl_data._M_finish = this_00;
        helics::ActionMessage::~ActionMessage(this_00);
        std::unique_lock<std::mutex>::~unique_lock(&local_1c0);
        goto LAB_002679ef;
      }
      std::condition_variable::wait((unique_lock *)&this->condition);
      pAVar1 = (this->pullElements).
               super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if ((this->pullElements).
          super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
          super__Vector_impl_data._M_start != pAVar1) goto LAB_002679bf;
      std::unique_lock<std::mutex>::unlock(&local_1c0);
      try_pop((optional<helics::ActionMessage> *)&local_f0,this);
      std::_Optional_payload_base<helics::ActionMessage>::_M_move_assign(&local_1b0,&local_f0);
      if (local_f0._M_engaged == true) {
        local_f0._M_engaged = false;
        helics::ActionMessage::~ActionMessage((ActionMessage *)&local_f0);
      }
      std::unique_lock<std::mutex>::~unique_lock(&local_1c0);
    } while (local_1b0._M_engaged == false);
  }
  helics::ActionMessage::ActionMessage(__return_storage_ptr__,(ActionMessage *)&local_1b0);
LAB_002679ef:
  if (local_1b0._M_engaged == true) {
    local_1b0._M_engaged = false;
    helics::ActionMessage::~ActionMessage((ActionMessage *)&local_1b0);
  }
  return __return_storage_ptr__;
}

Assistant:

T pop()
        {
            auto val = try_pop();
            while (!val) {
                std::unique_lock<MUTEX> pullLock(
                    m_pullLock);  // get the lock then wait
                if (!pullElements.empty())  // make sure we are actually empty;
                {
                    auto actval = std::move(pullElements.back());
                    pullElements.pop_back();
                    return actval;
                }
                condition.wait(pullLock);  // now wait
                if (!pullElements.empty())  // check for spurious wake-ups
                {
                    auto actval = std::move(pullElements.back());
                    pullElements.pop_back();
                    return actval;
                }
                pullLock.unlock();
                val = try_pop();
            }
            // move the value out of the optional
            return std::move(*val);
        }